

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.h
# Opt level: O2

void __thiscall xLearn::Trainer::~Trainer(Trainer *this)

{
  std::_Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>::~_Vector_base
            (&(this->metric_info_).
              super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>);
  std::_Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::~_Vector_base
            ((_Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)this);
  return;
}

Assistant:

~Trainer() {}